

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreImporter.cpp
# Opt level: O2

bool __thiscall
Assimp::Ogre::OgreImporter::CanRead
          (OgreImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  bool bVar2;
  undefined7 in_register_00000009;
  allocator local_5a;
  allocator local_59;
  char *tokens [1];
  string local_38;
  
  if ((int)CONCAT71(in_register_00000009,checkSig) == 0) {
    std::__cxx11::string::string((string *)tokens,".mesh.xml",&local_59);
    bVar1 = EndsWith(pFile,(string *)tokens,false);
    bVar2 = true;
    if (!bVar1) {
      std::__cxx11::string::string((string *)&local_38,".mesh",&local_5a);
      bVar2 = EndsWith(pFile,&local_38,false);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  else {
    std::__cxx11::string::string((string *)tokens,".mesh.xml",(allocator *)&local_38);
    bVar1 = EndsWith(pFile,(string *)tokens,false);
    std::__cxx11::string::~string((string *)tokens);
    if (bVar1) {
      tokens[0] = "<mesh>";
      bVar1 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,tokens,1,200,false,false);
      return bVar1;
    }
    std::__cxx11::string::string((string *)tokens,".mesh",(allocator *)&local_38);
    bVar2 = EndsWith(pFile,(string *)tokens,false);
  }
  std::__cxx11::string::~string((string *)tokens);
  return bVar2;
}

Assistant:

bool OgreImporter::CanRead(const std::string &pFile, Assimp::IOSystem *pIOHandler, bool checkSig) const
{
    if (!checkSig) {
        return EndsWith(pFile, ".mesh.xml", false) || EndsWith(pFile, ".mesh", false);
    }

    if (EndsWith(pFile, ".mesh.xml", false))
    {
        const char* tokens[] = { "<mesh>" };
        return SearchFileHeaderForToken(pIOHandler, pFile, tokens, 1);
    }
    else
    {
        /// @todo Read and validate first header chunk?
        return EndsWith(pFile, ".mesh", false);
    }
}